

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

_Bool run_container_validate(run_container_t *run,char **reason)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar3 = run->n_runs;
  if ((long)(int)uVar3 < 0) {
    pcVar5 = "negative run count";
  }
  else if (run->capacity < 0) {
    pcVar5 = "negative run capacity";
  }
  else if (run->capacity < (int)uVar3) {
    pcVar5 = "capacity less than run count";
  }
  else if (uVar3 == 0) {
    pcVar5 = "zero run count";
  }
  else {
    if (run->runs != (rle16_t *)0x0) {
      uVar6 = 0;
      uVar8 = 0;
      do {
        uVar1 = run->runs[uVar6].value;
        uVar2 = run->runs[uVar6].length;
        pcVar5 = "run start + length too large";
        if (((uint)uVar2 + (uint)uVar1 < 0x10000) &&
           (pcVar5 = "run start less than last end", uVar8 <= uVar1)) {
          uVar7 = (uint)uVar2 + (uint)uVar1 + 1;
          bVar4 = true;
          if ((uVar8 != 0) &&
             (pcVar5 = "run start equal to last end, should have combined", uVar8 == uVar1))
          goto LAB_0010edd9;
        }
        else {
LAB_0010edd9:
          *reason = pcVar5;
          bVar4 = false;
          uVar7 = uVar8;
        }
        uVar8 = uVar7;
        if (!bVar4) {
          return false;
        }
        uVar6 = uVar6 + 1;
        if (uVar3 == uVar6) {
          return (ulong)(long)(int)uVar3 <= uVar6;
        }
      } while( true );
    }
    pcVar5 = "NULL runs";
  }
  *reason = pcVar5;
  return false;
}

Assistant:

bool run_container_validate(const run_container_t *run, const char **reason) {
    if (run->n_runs < 0) {
        *reason = "negative run count";
        return false;
    }
    if (run->capacity < 0) {
        *reason = "negative run capacity";
        return false;
    }
    if (run->capacity < run->n_runs) {
        *reason = "capacity less than run count";
        return false;
    }

    if (run->n_runs == 0) {
        *reason = "zero run count";
        return false;
    }
    if (run->runs == NULL) {
        *reason = "NULL runs";
        return false;
    }

    // Use uint32_t to avoid overflow issues on ranges that contain UINT16_MAX.
    uint32_t last_end = 0;
    for (int i = 0; i < run->n_runs; ++i) {
        uint32_t start = run->runs[i].value;
        uint32_t end = start + run->runs[i].length + 1;
        if (end <= start) {
            *reason = "run start + length overflow";
            return false;
        }
        if (end > (1 << 16)) {
            *reason = "run start + length too large";
            return false;
        }
        if (start < last_end) {
            *reason = "run start less than last end";
            return false;
        }
        if (start == last_end && last_end != 0) {
            *reason = "run start equal to last end, should have combined";
            return false;
        }
        last_end = end;
    }
    return true;
}